

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucal.cpp
# Opt level: O0

void ucal_setTimeZone_63(UCalendar *cal,UChar *zoneID,int32_t len,UErrorCode *status)

{
  UBool UVar1;
  undefined8 local_38;
  TimeZone *zone;
  UErrorCode *status_local;
  int32_t len_local;
  UChar *zoneID_local;
  UCalendar *cal_local;
  
  UVar1 = U_FAILURE(*status);
  if (UVar1 == '\0') {
    if (zoneID == (UChar *)0x0) {
      local_38 = icu_63::TimeZone::createDefault();
    }
    else {
      local_38 = _createTimeZone(zoneID,len,status);
    }
    if (local_38 != (TimeZone *)0x0) {
      icu_63::Calendar::adoptTimeZone((Calendar *)cal,local_38);
    }
  }
  return;
}

Assistant:

U_CAPI void  U_EXPORT2
ucal_setTimeZone(    UCalendar*      cal,
            const    UChar*            zoneID,
            int32_t        len,
            UErrorCode *status)
{

  if(U_FAILURE(*status))
    return;

  TimeZone* zone = (zoneID==NULL) ? TimeZone::createDefault()
      : _createTimeZone(zoneID, len, status);

  if (zone != NULL) {
      ((Calendar*)cal)->adoptTimeZone(zone);
  }
}